

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestClock::expectUnchanged(TestClock *this,FsNode *file)

{
  bool bVar1;
  bool local_79;
  undefined1 local_78 [7];
  bool _kj_shouldLog;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel> aAStack_60 [3];
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel> local_48;
  undefined1 local_40 [8];
  DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_&>
  _kjCondition;
  FsNode *file_local;
  TestClock *this_local;
  
  _kjCondition._32_8_ = file;
  (*file->_vptr_FsNode[2])(local_78);
  local_48.value.value =
       (Quantity<long,_kj::_::NanosecondLabel>)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,aAStack_60);
  kj::_::DebugExpression<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::DateLabel>>::
  operator!=((DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_&>
              *)local_40,
             (DebugExpression<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::DateLabel>>
              *)&local_48,&this->time);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    local_79 = kj::_::Debug::shouldLog(ERROR);
    while (local_79 != false) {
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::DateLabel>,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::DateLabel>&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x11e,ERROR,
                 "\"failed: expected \" \"file.stat().lastModified != time\", _kjCondition",
                 (char (*) [50])"failed: expected file.stat().lastModified != time",
                 (DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_&>
                  *)local_40);
      local_79 = false;
    }
  }
  return;
}

Assistant:

void expectUnchanged(const FsNode& file) {
    KJ_EXPECT(file.stat().lastModified != time);
  }